

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::ActiveTipChange(ValidationSignals *this,CBlockIndex *new_tip,bool is_ibd)

{
  _List_node_base *p_Var1;
  _Head_base<0UL,_ValidationSignalsImpl_*,_false> mutexIn;
  bool bVar2;
  _List_iterator<ValidationSignalsImpl::ListEntry> __position;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  reverse_lock local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::LogAcceptCategory((LogFlags)this,(Level)new_tip);
  if (bVar2) {
    CBlockIndex::GetBlockHash((uint256 *)&lock,new_tip);
    base_blob<256u>::ToString_abi_cxx11_((string *)&local_98,(base_blob<256u> *)&lock);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    logging_function._M_str = "ActiveTipChange";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<char[16],std::__cxx11::string,int>
              (logging_function,source_file,0xbc,VALIDATION,Debug,
               (ConstevalFormatString<3U>)0xcd682a,(char (*) [16])"ActiveTipChange",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
               &new_tip->nHeight);
    std::__cxx11::string::~string((string *)&local_98);
  }
  mutexIn._M_head_impl =
       (this->m_internals)._M_t.
       super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
       _M_t.
       super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>.
       super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&lock,&(mutexIn._M_head_impl)->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
             ,0x53,false);
  __position._M_node =
       (_List_node_base *)
       (((mutex *)
        &((mutexIn._M_head_impl)->m_list).
         super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
        )->super___mutex_base)._M_mutex.__align;
  while (__position._M_node != (_List_node_base *)&(mutexIn._M_head_impl)->m_list) {
    *(int *)&__position._M_node[2]._M_next = *(int *)&__position._M_node[2]._M_next + 1;
    UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
              (&local_98,&lock,"lock",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
               ,0x57);
    (*(code *)(__position._M_node[1]._M_next)->_M_next->_M_prev)
              (__position._M_node[1]._M_next,new_tip,is_ibd);
    UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(&local_98);
    p_Var1 = __position._M_node + 2;
    *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + -1;
    if (*(int *)&p_Var1->_M_next == 0) {
      __position._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
           ::erase(&(mutexIn._M_head_impl)->m_list,__position._M_node);
    }
    else {
      __position = std::next<std::_List_iterator<ValidationSignalsImpl::ListEntry>>(__position,1);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::ActiveTipChange(const CBlockIndex& new_tip, bool is_ibd)
{
    LOG_EVENT("%s: new block hash=%s block height=%d", __func__, new_tip.GetBlockHash().ToString(), new_tip.nHeight);
    m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.ActiveTipChange(new_tip, is_ibd); });
}